

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

void __thiscall sentencepiece::NormalizerSpec::Clear(NormalizerSpec *this)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  undefined8 *puVar4;
  
  google::protobuf::internal::ExtensionSet::Clear(&this->_extensions_);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      puVar4 = (undefined8 *)((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar4[1] = 0;
      *(undefined1 *)*puVar4 = 0;
    }
    if ((uVar1 & 2) != 0) {
      puVar4 = (undefined8 *)
               ((ulong)(this->precompiled_charsmap_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar4[1] = 0;
      *(undefined1 *)*puVar4 = 0;
    }
    if ((uVar1 & 4) != 0) {
      puVar4 = (undefined8 *)
               ((ulong)(this->normalization_rule_tsv_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      puVar4[1] = 0;
      *(undefined1 *)*puVar4 = 0;
    }
    this->add_dummy_prefix_ = true;
    this->remove_extra_whitespaces_ = true;
    this->escape_whitespaces_ = true;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    uVar3 = (ulong)pvVar2 & 0xfffffffffffffffe;
    *(undefined8 *)(uVar3 + 0x10) = 0;
    **(undefined1 **)(uVar3 + 8) = 0;
  }
  return;
}

Assistant:

void NormalizerSpec::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.NormalizerSpec)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      precompiled_charsmap_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      normalization_rule_tsv_.ClearNonDefaultToEmpty();
    }
    add_dummy_prefix_ = true;
    remove_extra_whitespaces_ = true;
    escape_whitespaces_ = true;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}